

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::RegisterDataSourceRequest::Serialize
          (RegisterDataSourceRequest *this,Message *msg)

{
  _Head_base<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_false> this_00;
  uint8_t *src_begin;
  Message *msg_00;
  
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 2) != 0) {
    this_00._M_head_impl =
         (this->data_source_descriptor_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::DataSourceDescriptor,_std::default_delete<perfetto::protos::gen::DataSourceDescriptor>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_std::default_delete<perfetto::protos::gen::DataSourceDescriptor>_>
         .super__Head_base<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_false>._M_head_impl;
    msg_00 = protozero::Message::BeginNestedMessageInternal(msg,1);
    DataSourceDescriptor::Serialize(this_00._M_head_impl,msg_00);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void RegisterDataSourceRequest::Serialize(::protozero::Message* msg) const {
  // Field 1: data_source_descriptor
  if (_has_field_[1]) {
    (*data_source_descriptor_).Serialize(msg->BeginNestedMessage<::protozero::Message>(1));
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}